

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O1

bool __thiscall DataSourceDOS::check(DataSourceDOS *this)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  Stream *this_00;
  long *plVar4;
  long lVar5;
  pointer pbVar6;
  bool bVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string file_path;
  __string_type __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  default_file_names;
  string file_name;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  ostream *local_e8 [2];
  string *local_d8;
  pointer local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SPAE.PA","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"SPAF.PA","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"SPAD.PA","");
  plVar3 = local_40;
  local_50[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"SPAU.PA","");
  __l._M_len = 4;
  __l._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c8,__l,(allocator_type *)&local_138);
  lVar5 = -0x80;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  local_d8 = (string *)&(this->super_DataSourceLegacy).super_DataSourceBase.path;
  iVar2 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe])
                    (this);
  bVar7 = true;
  if ((char)iVar2 == '\0') {
    local_d0 = local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar7) {
      pbVar6 = local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar1 = (pbVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + pbVar6->_M_string_length);
        local_118._0_8_ = local_118 + 0x10;
        pcVar1 = (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,pcVar1,
                   pcVar1 + (this->super_DataSourceLegacy).super_DataSourceBase.path.
                            _M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)local_118,local_118._8_8_,0,'\x01');
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_118,(ulong)local_b0._M_dataplus._M_p);
        local_138 = &local_128;
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_128 = *plVar4;
          lStack_120 = plVar3[3];
        }
        else {
          local_128 = *plVar4;
          local_138 = (long *)*plVar3;
        }
        local_130 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        local_f8._M_allocated_capacity = (size_type)(local_118 + 0x30);
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_118 + 0x20),"data","");
        Log::Logger::operator[]((Logger *)local_118,(string *)&Log::Info);
        this_00 = Log::Stream::operator<<((Stream *)local_118,"Looking for game data in \'");
        std::__ostream_insert<char,std::char_traits<char>>
                  (this_00->stream,(char *)local_138,local_130);
        Log::Stream::operator<<(this_00,"\'...");
        Log::Stream::~Stream((Stream *)local_118);
        if ((undefined1 *)local_f8._M_allocated_capacity != local_118 + 0x30) {
          operator_delete((void *)local_f8._M_allocated_capacity,(ulong)(local_e8[0] + 1));
        }
        iVar2 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe]
                )(this,&local_138);
        if ((char)iVar2 != '\0') {
          std::__cxx11::string::operator=(local_d8,(string *)&local_138);
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        pbVar6 = pbVar6 + 1;
        bVar7 = pbVar6 != local_d0;
      } while (bVar7);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return bVar7;
}

Assistant:

bool
DataSourceDOS::check() {
  std::vector<std::string> default_file_names = {
    "SPAE.PA",  // English
    "SPAF.PA",  // French
    "SPAD.PA",  // German
    "SPAU.PA"   // Engish (US)
  };

  if (check_file(path)) {
    return true;
  }

  for (std::string file_name : default_file_names) {
    std::string file_path = path + '/' + file_name;
    Log::Info["data"] << "Looking for game data in '" << file_path << "'...";
    if (check_file(file_path)) {
      path = std::move(file_path);
      return true;
    }
  }

  return false;
}